

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O1

oonf_layer2_neigh *
dlep_session_get_local_l2_neighbor(dlep_session *session,oonf_layer2_neigh_key *key)

{
  oonf_log_source oVar1;
  long lVar2;
  avl_tree *paVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined8 uVar9;
  oonf_layer2_neigh_key_str nbuf1;
  oonf_layer2_neigh_key_str nbuf2;
  
  lVar2 = avl_find(&session->local_neighbor_tree);
  if (lVar2 == 0) {
    uVar8 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar8] & 2) != 0) {
      pcVar5 = oonf_layer2_neigh_key_to_string(&nbuf1,key,true);
      uVar9 = 2;
      uVar7 = 0x204;
      pcVar6 = "Could not find local neighbor for %s";
LAB_0011d16d:
      oonf_log(uVar9,uVar8,"src/generic/dlep/dlep_session.c",uVar7,0,0,pcVar6,pcVar5);
      return (oonf_layer2_neigh *)0x0;
    }
  }
  else {
    pcVar5 = (session->l2_listener).name;
    paVar3 = oonf_layer2_get_net_tree();
    lVar4 = avl_find(paVar3,pcVar5);
    if (lVar4 == 0) {
      uVar8 = (ulong)session->log_source;
      if (((&log_global_mask)[uVar8] & 1) != 0) {
        uVar9 = 1;
        uVar7 = 0x20a;
        pcVar5 = (session->l2_listener).name;
        pcVar6 = "Could not find l2net %s for new neighbor";
        goto LAB_0011d16d;
      }
    }
    else {
      lVar4 = avl_find(lVar4 + -0x710,(oonf_layer2_neigh_key *)(lVar2 + -0xb6));
      if (lVar4 != 0) {
        return (oonf_layer2_neigh *)(lVar4 + -0x4c0);
      }
      oVar1 = session->log_source;
      if (((&log_global_mask)[oVar1] & 2) != 0) {
        pcVar5 = oonf_layer2_neigh_key_to_string(&nbuf1,key,true);
        pcVar6 = oonf_layer2_neigh_key_to_string
                           (&nbuf2,(oonf_layer2_neigh_key *)(lVar2 + -0xb6),true);
        oonf_log(2,(ulong)oVar1,"src/generic/dlep/dlep_session.c",0x213,0,0,
                 "Could not find l2neigh for neighbor %s (%s)",pcVar5,pcVar6);
        return (oonf_layer2_neigh *)0x0;
      }
    }
  }
  return (oonf_layer2_neigh *)0x0;
}

Assistant:

struct oonf_layer2_neigh *
dlep_session_get_local_l2_neighbor(struct dlep_session *session, const struct oonf_layer2_neigh_key *key) {
  struct dlep_local_neighbor *dlep_neigh;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
#ifdef OONF_LOG_INFO
  union oonf_layer2_neigh_key_str nbuf1, nbuf2;
#endif

  dlep_neigh = dlep_session_get_local_neighbor(session, key);
  if (!dlep_neigh) {
    OONF_INFO(session->log_source, "Could not find local neighbor for %s",
              oonf_layer2_neigh_key_to_string(&nbuf1, key, true));
    return NULL;
  }

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    OONF_DEBUG(session->log_source, "Could not find l2net %s for new neighbor", session->l2_listener.name);
    return NULL;
  }

  l2neigh = oonf_layer2_neigh_get_lid(l2net, &dlep_neigh->neigh_key);
  if (!l2neigh) {
    OONF_INFO(session->log_source,
      "Could not find l2neigh for neighbor %s (%s)",
      oonf_layer2_neigh_key_to_string(&nbuf1, key, true),
      oonf_layer2_neigh_key_to_string(&nbuf2, &dlep_neigh->neigh_key, true));
    return NULL;
  }
  return l2neigh;
}